

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_ServerRejectsMissingTransportParams_Test::
QUICMethodTest_ServerRejectsMissingTransportParams_Test
          (QUICMethodTest_ServerRejectsMissingTransportParams_Test *this)

{
  QUICMethodTest_ServerRejectsMissingTransportParams_Test *this_local;
  
  QUICMethodTest::QUICMethodTest(&this->super_QUICMethodTest);
  (this->super_QUICMethodTest).super_Test._vptr_Test =
       (_func_int **)&PTR__QUICMethodTest_ServerRejectsMissingTransportParams_Test_00648158;
  return;
}

Assistant:

TEST_F(QUICMethodTest, ServerRejectsMissingTransportParams) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  ASSERT_TRUE(CreateClientAndServer());
  ASSERT_TRUE(SSL_set_quic_transport_params(client_.get(), nullptr, 0));
  ASSERT_TRUE(RunQUICHandshakesAndExpectError(ExpectedError::kClientError));
}